

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall DialogPrompt::draw(DialogPrompt *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  Transformable *in_RSI;
  long in_RDI;
  CheckBox *c;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<CheckBox,_std::allocator<CheckBox>_> *__range2_2;
  TextField *f;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<TextField,_std::allocator<TextField>_> *__range2_1;
  TextButton *b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<TextButton,_std::allocator<TextButton>_> *__range2;
  Transform *in_stack_ffffffffffffff78;
  Transform *left;
  __normal_iterator<const_CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_> local_60;
  long local_58;
  reference local_50;
  TextField *local_48;
  __normal_iterator<const_TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_> local_40
  ;
  long local_38;
  reference local_30;
  TextButton *local_28;
  __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
  local_20;
  long local_18;
  
  left = (Transform *)&stack0x00000008;
  if ((*(byte *)(in_RDI + 0xb1) & 1) != 0) {
    sf::Transformable::getTransform(in_RSI);
    sf::operator*=(left,in_stack_ffffffffffffff78);
    sf::RenderTarget::draw
              ((RenderTarget *)__end2._M_current,(Drawable *)b,(RenderStates *)__range2_1);
    sf::RenderTarget::draw
              ((RenderTarget *)__end2._M_current,(Drawable *)b,(RenderStates *)__range2_1);
    local_18 = in_RDI + 0x380;
    local_20._M_current =
         (TextButton *)
         std::vector<TextButton,_std::allocator<TextButton>_>::begin
                   ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffff78);
    local_28 = (TextButton *)
               std::vector<TextButton,_std::allocator<TextButton>_>::end
                         ((vector<TextButton,_std::allocator<TextButton>_> *)
                          in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)left,(__normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                                       *)in_stack_ffffffffffffff78), bVar1) {
      local_30 = __gnu_cxx::
                 __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                 ::operator*(&local_20);
      sf::RenderTarget::draw
                ((RenderTarget *)__end2._M_current,(Drawable *)b,(RenderStates *)__range2_1);
      __gnu_cxx::
      __normal_iterator<const_TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>::
      operator++(&local_20);
    }
    local_38 = in_RDI + 0x398;
    local_40._M_current =
         (TextField *)
         std::vector<TextField,_std::allocator<TextField>_>::begin
                   ((vector<TextField,_std::allocator<TextField>_> *)in_stack_ffffffffffffff78);
    local_48 = (TextField *)
               std::vector<TextField,_std::allocator<TextField>_>::end
                         ((vector<TextField,_std::allocator<TextField>_> *)in_stack_ffffffffffffff78
                         );
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                               *)left,(__normal_iterator<const_TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                                       *)in_stack_ffffffffffffff78), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>
                 ::operator*(&local_40);
      sf::RenderTarget::draw
                ((RenderTarget *)__end2._M_current,(Drawable *)b,(RenderStates *)__range2_1);
      __gnu_cxx::
      __normal_iterator<const_TextField_*,_std::vector<TextField,_std::allocator<TextField>_>_>::
      operator++(&local_40);
    }
    local_58 = in_RDI + 0x3b0;
    local_60._M_current =
         (CheckBox *)
         std::vector<CheckBox,_std::allocator<CheckBox>_>::begin
                   ((vector<CheckBox,_std::allocator<CheckBox>_> *)in_stack_ffffffffffffff78);
    std::vector<CheckBox,_std::allocator<CheckBox>_>::end
              ((vector<CheckBox,_std::allocator<CheckBox>_> *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>
                               *)left,(__normal_iterator<const_CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>
                                       *)in_stack_ffffffffffffff78), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>::
      operator*(&local_60);
      sf::RenderTarget::draw
                ((RenderTarget *)__end2._M_current,(Drawable *)b,(RenderStates *)__range2_1);
      __gnu_cxx::
      __normal_iterator<const_CheckBox_*,_std::vector<CheckBox,_std::allocator<CheckBox>_>_>::
      operator++(&local_60);
    }
  }
  return;
}

Assistant:

void DialogPrompt::draw(RenderTarget& target, RenderStates states) const {
    if (visible) {
        states.transform *= getTransform();
        target.draw(background, states);
        target.draw(text, states);
        for (const TextButton& b : optionButtons) {
            target.draw(b, states);
        }
        for (const TextField& f : optionFields) {
            target.draw(f, states);
        }
        for (const CheckBox& c : optionChecks) {
            target.draw(c, states);
        }
    }
}